

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O1

int __thiscall
MeCab::DictionaryRewriter::open(DictionaryRewriter *this,char *__file,int __oflag,...)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  istream *piVar6;
  undefined8 uVar7;
  string line;
  ifstream ifs;
  die local_279;
  string local_278;
  RewriteRules *local_258;
  DictionaryRewriter *local_250;
  RewriteRules *local_248;
  long local_240;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((istream *)local_238,__file,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ifs",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"no such file or directory: ",0x1b);
    if (__file == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen(__file);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__file,sVar5);
    }
    die::~die((die *)&local_278);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  local_258 = &this->right_rewrite_;
  local_248 = &this->left_rewrite_;
  local_240 = 0;
  local_250 = this;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar3 = (int)local_240;
        do {
          cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                  (char)(istream *)local_238);
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_238,(string *)&local_278,cVar1);
          if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p);
            }
            uVar7 = std::ifstream::~ifstream(local_238);
            return (int)CONCAT71((int7)((ulong)uVar7 >> 8),1);
          }
          if (___oflag != (Iconv *)0x0) {
            Iconv::convert(___oflag,&local_278);
          }
        } while ((local_278._M_string_length == 0) || (*local_278._M_dataplus._M_p == '#'));
        iVar2 = std::__cxx11::string::compare((char *)&local_278);
        if (iVar2 != 0) break;
        local_240 = 1;
      }
      iVar2 = std::__cxx11::string::compare((char *)&local_278);
      if (iVar2 != 0) break;
      local_240 = 2;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_278);
    if (iVar2 != 0) break;
    local_240 = 3;
  }
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x95);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"append_to != 0",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"no sections found",0x11);
    die::~die(&local_279);
  }
  iVar3 = (*(code *)(&DAT_001846c8 + *(int *)(&DAT_001846c8 + local_240 * 4)))
                    (local_248,local_278._M_dataplus._M_p);
  return iVar3;
}

Assistant:

bool DictionaryRewriter::open(const char *filename,
                              Iconv *iconv) {
  std::ifstream ifs(WPATH(filename));
  CHECK_DIE(ifs) << "no such file or directory: " << filename;
  int append_to = 0;
  std::string line;
  while (std::getline(ifs, line)) {
    if (iconv) iconv->convert(&line);
    if (line.empty() || line[0] == '#') continue;
    if (line == "[unigram rewrite]") {
      append_to = 1;
    } else if (line == "[left rewrite]") {
      append_to = 2;
    } else if (line == "[right rewrite]") {
      append_to = 3;
    } else {
      CHECK_DIE(append_to != 0) << "no sections found";
      char *str = const_cast<char *>(line.c_str());
      switch (append_to) {
        case 1: append_rewrite_rule(&unigram_rewrite_, str); break;
        case 2: append_rewrite_rule(&left_rewrite_,    str); break;
        case 3: append_rewrite_rule(&right_rewrite_,   str); break;
      }
    }
  }
  return true;
}